

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize.cpp
# Opt level: O2

void serialize_combined(IsoForest *model,ExtIsoForest *model_ext,Imputer *imputer,
                       TreesIndexer *indexer,char *optional_metadata,size_t size_optional_metadata,
                       ostream *out)

{
  runtime_error *this;
  undefined1 auVar1 [16];
  undefined1 uStack_72;
  undefined1 uStack_71;
  size_t sStack_70;
  size_t sStack_68;
  SignalSwitcher SStack_60;
  char *pcStack_50;
  undefined8 uStack_48;
  undefined8 uStack_40;
  undefined8 uStack_38;
  
  sStack_68 = size_optional_metadata;
  pcStack_50 = optional_metadata;
  SignalSwitcher::SignalSwitcher(&SStack_60);
  auVar1 = std::ostream::tellp();
  uStack_48 = auVar1._8_8_;
  uStack_40 = auVar1._0_8_;
  add_setup_info<std::ostream>(out,false);
  uStack_72 = 4;
  write_bytes<unsigned_char>(&uStack_72,1,out);
  if (model == (IsoForest *)0x0) {
    if (model_ext == (ExtIsoForest *)0x0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Must pass one of \'model\' or \'model_ext\'.\n");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    if (size_optional_metadata == 0) {
      if (imputer == (Imputer *)0x0) {
        if (indexer == (TreesIndexer *)0x0) {
          uStack_72 = 2;
        }
        else {
          uStack_72 = 0xe;
        }
      }
      else if (indexer == (TreesIndexer *)0x0) {
        uStack_72 = 5;
      }
      else {
        uStack_72 = 0xf;
      }
    }
    else if (imputer == (Imputer *)0x0) {
      if (indexer == (TreesIndexer *)0x0) {
        uStack_72 = 7;
      }
      else {
        uStack_72 = 0x11;
      }
    }
    else if (indexer == (TreesIndexer *)0x0) {
      uStack_72 = 9;
    }
    else {
      uStack_72 = 0x13;
    }
  }
  else if (size_optional_metadata == 0) {
    if (imputer == (Imputer *)0x0) {
      if (indexer == (TreesIndexer *)0x0) {
        uStack_72 = 1;
      }
      else {
        uStack_72 = 0xc;
      }
    }
    else if (indexer == (TreesIndexer *)0x0) {
      uStack_72 = 4;
    }
    else {
      uStack_72 = 0xd;
    }
  }
  else if (imputer == (Imputer *)0x0) {
    if (indexer == (TreesIndexer *)0x0) {
      uStack_72 = 6;
    }
    else {
      uStack_72 = 0x10;
    }
  }
  else if (indexer == (TreesIndexer *)0x0) {
    uStack_72 = 8;
  }
  else {
    uStack_72 = 0x12;
  }
  write_bytes<unsigned_char>(&uStack_72,1,out);
  if (model == (IsoForest *)0x0) {
    sStack_70 = get_size_model(model_ext);
  }
  else {
    sStack_70 = get_size_model(model);
  }
  write_bytes<unsigned_long>(&sStack_70,1,out);
  if (imputer == (Imputer *)0x0) {
    sStack_70 = 0;
  }
  else {
    sStack_70 = get_size_model(imputer);
  }
  write_bytes<unsigned_long>(&sStack_70,1,out);
  if (indexer == (TreesIndexer *)0x0) {
    sStack_70 = 0;
  }
  else {
    sStack_70 = get_size_model(indexer);
  }
  write_bytes<unsigned_long>(&sStack_70,1,out);
  write_bytes<unsigned_long>(&sStack_68,1,out);
  check_interrupt_switch(&SStack_60);
  if (model == (IsoForest *)0x0) {
    serialize_model<std::ostream>(model_ext,out);
  }
  else {
    serialize_model<std::ostream>(model,out);
  }
  if (imputer != (Imputer *)0x0) {
    serialize_model<std::ostream>(imputer,out);
  }
  if (indexer != (TreesIndexer *)0x0) {
    serialize_model<std::ostream>(indexer,out);
  }
  if (sStack_68 != 0) {
    write_bytes<char>(pcStack_50,sStack_68,out);
  }
  check_interrupt_switch(&SStack_60);
  uStack_71 = 0;
  write_bytes<unsigned_char>(&uStack_71,1,out);
  uStack_38 = 0;
  write_bytes<unsigned_long>(&uStack_38,1,out);
  auVar1 = std::ostream::tellp();
  std::ostream::seekp(out,uStack_40,uStack_48);
  add_full_watermark<std::ostream>(out);
  std::ostream::seekp(out,auVar1._0_8_,auVar1._8_8_);
  SignalSwitcher::~SignalSwitcher(&SStack_60);
  return;
}

Assistant:

void serialize_combined
(
    const IsoForest *model,
    const ExtIsoForest *model_ext,
    const Imputer *imputer,
    const TreesIndexer *indexer,
    const char *optional_metadata,
    const size_t size_optional_metadata,
    std::ostream &out
)
{
    serialize_combined<std::ostream>(
        model,
        model_ext,
        imputer,
        indexer,
        optional_metadata,
        size_optional_metadata,
        out
    );
}